

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_generators.hpp
# Opt level: O3

void __thiscall
Catch::Generators::Generators<xxx::v0::errc>::
Generators<Catch::Generators::GeneratorWrapper<xxx::v0::errc>>
          (Generators<xxx::v0::errc> *this,GeneratorWrapper<xxx::v0::errc> *moreGenerators)

{
  (this->super_IGenerator<xxx::v0::errc>).super_GeneratorUntypedBase.m_stringReprCache._M_dataplus.
  _M_p = (pointer)&(this->super_IGenerator<xxx::v0::errc>).super_GeneratorUntypedBase.
                   m_stringReprCache.field_2;
  (this->super_IGenerator<xxx::v0::errc>).super_GeneratorUntypedBase.m_stringReprCache.
  _M_string_length = 0;
  (this->super_IGenerator<xxx::v0::errc>).super_GeneratorUntypedBase.m_stringReprCache.field_2.
  _M_local_buf[0] = '\0';
  (this->super_IGenerator<xxx::v0::errc>).super_GeneratorUntypedBase.m_currentElementIndex = 0;
  (this->super_IGenerator<xxx::v0::errc>).super_GeneratorUntypedBase._vptr_GeneratorUntypedBase =
       (_func_int **)&PTR_next_00190ed0;
  (this->m_generators).
  super__Vector_base<Catch::Generators::GeneratorWrapper<xxx::v0::errc>,_std::allocator<Catch::Generators::GeneratorWrapper<xxx::v0::errc>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_generators).
  super__Vector_base<Catch::Generators::GeneratorWrapper<xxx::v0::errc>,_std::allocator<Catch::Generators::GeneratorWrapper<xxx::v0::errc>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_generators).
  super__Vector_base<Catch::Generators::GeneratorWrapper<xxx::v0::errc>,_std::allocator<Catch::Generators::GeneratorWrapper<xxx::v0::errc>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_current = 0;
  std::
  vector<Catch::Generators::GeneratorWrapper<xxx::v0::errc>,_std::allocator<Catch::Generators::GeneratorWrapper<xxx::v0::errc>_>_>
  ::reserve(&this->m_generators,1);
  std::
  vector<Catch::Generators::GeneratorWrapper<xxx::v0::errc>,std::allocator<Catch::Generators::GeneratorWrapper<xxx::v0::errc>>>
  ::emplace_back<Catch::Generators::GeneratorWrapper<xxx::v0::errc>>
            ((vector<Catch::Generators::GeneratorWrapper<xxx::v0::errc>,std::allocator<Catch::Generators::GeneratorWrapper<xxx::v0::errc>>>
              *)&this->m_generators,moreGenerators);
  return;
}

Assistant:

Generators(Gs &&... moreGenerators) {
            m_generators.reserve(sizeof...(Gs));
            add_generators(CATCH_FORWARD(moreGenerators)...);
        }